

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparator.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_2::BytewiseComparatorImpl::FindShortestSeparator
          (BytewiseComparatorImpl *this,string *start,Slice *limit)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  size_t n;
  ulong uVar7;
  long in_FS_OFFSET;
  pointer local_48;
  size_type local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = start->_M_string_length;
  if (limit->size_ < start->_M_string_length) {
    uVar7 = limit->size_;
  }
  n = 0;
  do {
    if (uVar7 == n) {
LAB_005477c4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    cVar2 = (start->_M_dataplus)._M_p[n];
    cVar3 = Slice::operator[](limit,n);
    if (cVar2 != cVar3) {
      uVar6 = (uint)(byte)(start->_M_dataplus)._M_p[n];
      if (uVar6 != 0xff) {
        bVar4 = Slice::operator[](limit,n);
        if (uVar6 + 1 < (uint)bVar4) {
          pcVar1 = (start->_M_dataplus)._M_p + n;
          *pcVar1 = *pcVar1 + '\x01';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    (start,n + 1);
          local_48 = (start->_M_dataplus)._M_p;
          local_40 = start->_M_string_length;
          iVar5 = (*(this->super_Comparator)._vptr_Comparator[2])(this,&local_48,limit);
          if (-1 < iVar5) {
            __assert_fail("Compare(*start, limit) < 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/comparator.cc"
                          ,0x31,
                          "virtual void leveldb::(anonymous namespace)::BytewiseComparatorImpl::FindShortestSeparator(std::string *, const Slice &) const"
                         );
          }
        }
      }
      goto LAB_005477c4;
    }
    n = n + 1;
  } while( true );
}

Assistant:

void FindShortestSeparator(std::string* start,
                             const Slice& limit) const override {
    // Find length of common prefix
    size_t min_length = std::min(start->size(), limit.size());
    size_t diff_index = 0;
    while ((diff_index < min_length) &&
           ((*start)[diff_index] == limit[diff_index])) {
      diff_index++;
    }

    if (diff_index >= min_length) {
      // Do not shorten if one string is a prefix of the other
    } else {
      uint8_t diff_byte = static_cast<uint8_t>((*start)[diff_index]);
      if (diff_byte < static_cast<uint8_t>(0xff) &&
          diff_byte + 1 < static_cast<uint8_t>(limit[diff_index])) {
        (*start)[diff_index]++;
        start->resize(diff_index + 1);
        assert(Compare(*start, limit) < 0);
      }
    }
  }